

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

uint8_t * svb_encode_scalar_d1_init
                    (uint32_t *in,uint8_t *keyPtr,uint8_t *dataPtr,uint32_t count,uint32_t prev)

{
  uint32_t uVar1;
  uint8_t *dataPtr_1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  
  if (count != 0) {
    uVar2 = 0;
    bVar5 = 0;
    uVar6 = 0;
    do {
      if ((char)uVar6 == '\b') {
        *keyPtr = bVar5;
        keyPtr = keyPtr + 1;
        uVar6 = 0;
        bVar5 = 0;
      }
      uVar1 = in[uVar2];
      uVar3 = uVar1 - prev;
      if (uVar3 < 0x100) {
        *dataPtr = (uint8_t)uVar3;
        iVar7 = 0;
        lVar4 = 1;
      }
      else if (uVar3 < 0x10000) {
        *(short *)dataPtr = (short)uVar3;
        iVar7 = 1;
        lVar4 = 2;
      }
      else if (uVar3 < 0x1000000) {
        *(short *)dataPtr = (short)uVar3;
        *(uint8_t *)((long)dataPtr + 2) = (uint8_t)(uVar3 >> 0x10);
        iVar7 = 2;
        lVar4 = 3;
      }
      else {
        *(uint *)dataPtr = uVar3;
        iVar7 = 3;
        lVar4 = 4;
      }
      dataPtr = (uint8_t *)((long)dataPtr + lVar4);
      bVar5 = bVar5 | (byte)(iVar7 << (uVar6 & 0x1f));
      uVar6 = (uint)(byte)((char)uVar6 + 2);
      uVar2 = uVar2 + 1;
      prev = uVar1;
    } while (count != uVar2);
    *keyPtr = bVar5;
  }
  return dataPtr;
}

Assistant:

uint8_t *svb_encode_scalar_d1_init(const uint32_t *in,
                                   uint8_t *__restrict__ keyPtr,
                                   uint8_t *__restrict__ dataPtr,
                                   uint32_t count, uint32_t prev) {
  if (count == 0)
    return dataPtr; // exit immediately if no data

  uint8_t shift = 0; // cycles 0, 2, 4, 6, 0, 2, 4, 6, ...
  uint8_t key = 0;
  for (uint32_t c = 0; c < count; c++) {
    if (shift == 8) {
      shift = 0;
      *keyPtr++ = key;
      key = 0;
    }
    uint32_t val = in[c] - prev;
    prev = in[c];
    uint8_t code = _encode_data(val, &dataPtr);
    key |= code << shift;
    shift += 2;
  }

  *keyPtr = key;  // write last key (no increment needed)
  return dataPtr; // pointer to first unused data byte
}